

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTimeZone::OffsetData>::moveAppend
          (QGenericArrayOps<QTimeZone::OffsetData> *this,OffsetData *b,OffsetData *e)

{
  OffsetData *pOVar1;
  OffsetData *pOVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  int iVar6;
  long lVar7;
  
  if ((b != e) && (b < e)) {
    pOVar2 = (this->super_QArrayDataPointer<QTimeZone::OffsetData>).ptr;
    lVar7 = (this->super_QArrayDataPointer<QTimeZone::OffsetData>).size;
    do {
      pDVar3 = (b->abbreviation).d.d;
      (b->abbreviation).d.d = (Data *)0x0;
      pOVar1 = pOVar2 + lVar7;
      (pOVar1->abbreviation).d.d = pDVar3;
      pcVar4 = (b->abbreviation).d.ptr;
      (b->abbreviation).d.ptr = (char16_t *)0x0;
      (pOVar1->abbreviation).d.ptr = pcVar4;
      qVar5 = (b->abbreviation).d.size;
      (b->abbreviation).d.size = 0;
      (pOVar1->abbreviation).d.size = qVar5;
      QDateTime::QDateTime(&pOVar1->atUtc,&b->atUtc);
      pOVar1->daylightTimeOffset = b->daylightTimeOffset;
      iVar6 = b->standardTimeOffset;
      pOVar1->offsetFromUtc = b->offsetFromUtc;
      pOVar1->standardTimeOffset = iVar6;
      lVar7 = (this->super_QArrayDataPointer<QTimeZone::OffsetData>).size + 1;
      (this->super_QArrayDataPointer<QTimeZone::OffsetData>).size = lVar7;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }